

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

UnaryOperator slang::ast::Expression::getUnaryOperator(SyntaxKind kind)

{
  UnaryOperator UVar1;
  logic_error *this;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(kind) {
  case UnaryBitwiseAndExpression:
    UVar1 = BitwiseAnd;
    break;
  case UnaryBitwiseNandExpression:
    UVar1 = BitwiseNand;
    break;
  case UnaryBitwiseNorExpression:
    UVar1 = BitwiseNor;
    break;
  case UnaryBitwiseNotExpression:
    UVar1 = BitwiseNot;
    break;
  case UnaryBitwiseOrExpression:
    UVar1 = BitwiseOr;
    break;
  case UnaryBitwiseXnorExpression:
    UVar1 = BitwiseXnor;
    break;
  case UnaryBitwiseXorExpression:
    UVar1 = BitwiseXor;
    break;
  case UnaryLogicalNotExpression:
    UVar1 = LogicalNot;
    break;
  case UnaryMinusExpression:
    UVar1 = Minus;
    break;
  case UnaryPlusExpression:
    UVar1 = Plus;
    break;
  case UnaryPredecrementExpression:
    UVar1 = Predecrement;
    break;
  case UnaryPreincrementExpression:
    UVar1 = Preincrement;
    break;
  default:
    if (kind == PostdecrementExpression) {
      UVar1 = Postdecrement;
    }
    else {
      if (kind != PostincrementExpression) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                   ,&local_d9);
        std::operator+(&local_98,&local_b8,":");
        std::__cxx11::to_string(&local_d8,0x7bc);
        std::operator+(&local_78,&local_98,&local_d8);
        std::operator+(&local_58,&local_78,": ");
        std::operator+(&local_38,&local_58,"Default case should be unreachable!");
        std::logic_error::logic_error(this,(string *)&local_38);
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      UVar1 = Postincrement;
    }
  }
  return UVar1;
}

Assistant:

UnaryOperator Expression::getUnaryOperator(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UnaryPlusExpression:
            return UnaryOperator::Plus;
        case SyntaxKind::UnaryMinusExpression:
            return UnaryOperator::Minus;
        case SyntaxKind::UnaryBitwiseNotExpression:
            return UnaryOperator::BitwiseNot;
        case SyntaxKind::UnaryBitwiseAndExpression:
            return UnaryOperator::BitwiseAnd;
        case SyntaxKind::UnaryBitwiseOrExpression:
            return UnaryOperator::BitwiseOr;
        case SyntaxKind::UnaryBitwiseXorExpression:
            return UnaryOperator::BitwiseXor;
        case SyntaxKind::UnaryBitwiseNandExpression:
            return UnaryOperator::BitwiseNand;
        case SyntaxKind::UnaryBitwiseNorExpression:
            return UnaryOperator::BitwiseNor;
        case SyntaxKind::UnaryBitwiseXnorExpression:
            return UnaryOperator::BitwiseXnor;
        case SyntaxKind::UnaryLogicalNotExpression:
            return UnaryOperator::LogicalNot;
        case SyntaxKind::UnaryPreincrementExpression:
            return UnaryOperator::Preincrement;
        case SyntaxKind::UnaryPredecrementExpression:
            return UnaryOperator::Predecrement;
        case SyntaxKind::PostincrementExpression:
            return UnaryOperator::Postincrement;
        case SyntaxKind::PostdecrementExpression:
            return UnaryOperator::Postdecrement;
        default:
            ASSUME_UNREACHABLE;
    }
}